

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O2

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1,Enum args_2)

{
  Enum local_44;
  Enum local_40;
  Enum local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if (result.enum_ == Error) {
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    local_44 = args.enum_;
    local_40 = args_1.enum_;
    local_3c = args_2;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_38,&local_44);
    PrintStackIfFailed(this,(Result)0x1,desc,(TypeVector *)&local_38);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_38);
  }
  return;
}

Assistant:

inline bool Failed(Result result) {
  return result == Result::Error;
}